

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

bool __thiscall QTableModel::setData(QTableModel *this,QModelIndex *index,QVariant *value,int role)

{
  bool bVar1;
  QTableWidgetItem *pQVar2;
  QTableWidget *this_00;
  
  bVar1 = false;
  if (((-1 < index->r) && (bVar1 = false, -1 < index->c)) &&
     (bVar1 = false, (index->m).ptr != (QAbstractItemModel *)0x0)) {
    pQVar2 = item(this,index);
    if (pQVar2 == (QTableWidgetItem *)0x0) {
      if ((*(ulong *)&(value->d).field_0x18 < 4) ||
         (this_00 = (QTableWidget *)QMetaObject::cast((QObject *)&QTableWidget::staticMetaObject),
         this_00 == (QTableWidget *)0x0)) {
        return false;
      }
      pQVar2 = createItem(this);
      (*pQVar2->_vptr_QTableWidgetItem[4])(pQVar2,(ulong)(uint)role,value);
      QTableWidget::setItem(this_00,index->r,index->c,pQVar2);
    }
    else {
      (*pQVar2->_vptr_QTableWidgetItem[4])(pQVar2,(ulong)(uint)role,value);
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool QTableModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (!index.isValid())
        return false;

    QTableWidgetItem *itm = item(index);
    if (itm) {
        itm->setData(role, value);
        return true;
    }

    // don't create dummy table items for empty values
    if (!value.isValid())
        return false;

    QTableWidget *view = this->view();
    if (!view)
        return false;

    itm = createItem();
    itm->setData(role, value);
    view->setItem(index.row(), index.column(), itm);
    return true;
}